

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum.cpp
# Opt level: O3

bool __thiscall
OpenCLEnum::queryDeviceInfo
          (OpenCLEnum *this,cl_device_id device_id,uint param,string *value,string *param_name,
          size_t max_size)

{
  pointer pcVar1;
  char *__s;
  char *pcVar2;
  uint uVar3;
  ostream *poVar4;
  cl_int code;
  cl_int code_00;
  bool bVar5;
  vector<char,_std::allocator<char>_> data;
  size_type local_68;
  string local_60;
  vector<char,_std::allocator<char>_> local_40;
  
  local_68 = max_size;
  if ((max_size == 0) &&
     (uVar3 = clGetDeviceInfo(device_id,param,0,(void *)0x0,&local_68), uVar3 != 0)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"clGetDeviceInfo(",0x10);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(param_name->_M_dataplus)._M_p,
                        param_name->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") failed: ",10);
    ocl::errorString_abi_cxx11_(&local_60,(ocl *)(ulong)uVar3,code_00);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,local_60._M_dataplus._M_p,local_60._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    bVar5 = false;
  }
  else {
    std::vector<char,_std::allocator<char>_>::vector(&local_40,local_68,(allocator_type *)&local_60)
    ;
    uVar3 = clGetDeviceInfo(device_id,param,local_68,
                            local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start,&local_68);
    bVar5 = uVar3 == 0;
    if (bVar5) {
      pcVar1 = (value->_M_dataplus)._M_p;
      std::__cxx11::string::
      _M_replace_dispatch<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                ((string *)value,pcVar1,pcVar1 + value->_M_string_length,
                 local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start + local_68);
      __s = (value->_M_dataplus)._M_p;
      pcVar2 = (char *)value->_M_string_length;
      strlen(__s);
      std::__cxx11::string::_M_replace((ulong)value,0,pcVar2,(ulong)__s);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"clGetDeviceInfo(",0x10);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(param_name->_M_dataplus)._M_p,
                          param_name->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,") failed: ",10);
      ocl::errorString_abi_cxx11_(&local_60,(ocl *)(ulong)uVar3,code);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,local_60._M_dataplus._M_p,local_60._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p);
      }
    }
    if (local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  return bVar5;
}

Assistant:

bool OpenCLEnum::queryDeviceInfo(cl_device_id device_id, unsigned int param, std::string &value, const std::string &param_name, size_t max_size)
{
	cl_int res;
	if (max_size == 0) {
		res = clGetDeviceInfo(device_id, param, 0, NULL, &max_size);
		if (res != CL_SUCCESS) {
			std::cerr << "clGetDeviceInfo(" << param_name << ") failed: " << ocl::errorString(res) << std::endl;
			return false;
		}
	}

	std::vector<char> data(max_size);
	res = clGetDeviceInfo(device_id, param, max_size, data.data(), &max_size);
	if (res != CL_SUCCESS) {
		std::cerr << "clGetDeviceInfo(" << param_name << ") failed: " << ocl::errorString(res) << std::endl;
		return false;
	}

	value.assign(data.begin(), data.begin() + max_size);
	value = value.c_str();	// remove trailing null chars
	return true;
}